

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyNormalizeSpaces(Lexer *lexer,Node *node)

{
  byte bVar1;
  Bool BVar2;
  uint uVar3;
  tmbstr buf;
  uint uVar4;
  ulong uVar5;
  uint c;
  uint local_2c;
  
  if (node != (Node *)0x0) {
    do {
      if (node->content != (Node *)0x0) {
        prvTidyNormalizeSpaces(lexer,node->content);
      }
      BVar2 = prvTidynodeIsText(node);
      if (BVar2 != no) {
        uVar5 = (ulong)node->start;
        buf = lexer->lexbuf + uVar5;
        while (uVar4 = (uint)uVar5, uVar4 < node->end) {
          bVar1 = lexer->lexbuf[uVar5];
          local_2c = (uint)bVar1;
          if ((char)bVar1 < '\0') {
            uVar3 = prvTidyGetUTF8(lexer->lexbuf + uVar5,&local_2c);
            uVar4 = uVar4 + uVar3;
          }
          if (local_2c == 0xa0) {
            local_2c = 0x20;
          }
          buf = prvTidyPutUTF8(buf,local_2c);
          uVar5 = (ulong)(uVar4 + 1);
        }
        node->end = (int)buf - *(int *)&lexer->lexbuf;
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(NormalizeSpaces)(Lexer *lexer, Node *node)
{
    while ( node )
    {
        if ( node->content )
            TY_(NormalizeSpaces)( lexer, node->content );

        if (TY_(nodeIsText)(node))
        {
            uint i, c;
            tmbstr p = lexer->lexbuf + node->start;

            for (i = node->start; i < node->end; ++i)
            {
                c = (byte) lexer->lexbuf[i];

                /* look for UTF-8 multibyte character */
                if ( c > 0x7F )
                    i += TY_(GetUTF8)( lexer->lexbuf + i, &c );

                if ( c == 160 )
                    c = ' ';

                p = TY_(PutUTF8)(p, c);
            }
            node->end = p - lexer->lexbuf;
        }

        node = node->next;
    }
}